

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorTables::AddFieldByStylizedNames
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  void *pvVar1;
  long lStack_50;
  FieldDescriptor *field_local;
  PointerStringPair camelcase_key;
  PointerStringPair lowercase_key;
  
  if (field[0x34] == (FieldDescriptor)0x1) {
    pvVar1 = *(void **)(field + 0x40);
    if (pvVar1 != (void *)0x0) goto LAB_001dc8ef;
    lStack_50 = 0x20;
  }
  else {
    lStack_50 = 0x38;
  }
  pvVar1 = *(void **)(field + lStack_50);
LAB_001dc8ef:
  lowercase_key.second = (char *)**(undefined8 **)(field + 0x10);
  field_local = field;
  lowercase_key.first = pvVar1;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_lowercase_name_,&lowercase_key,&field_local);
  camelcase_key.second = (char *)**(undefined8 **)(field + 0x18);
  camelcase_key.first = pvVar1;
  InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*>
            (&this->fields_by_camelcase_name_,&camelcase_key,&field_local);
  return;
}

Assistant:

void FileDescriptorTables::AddFieldByStylizedNames(
    const FieldDescriptor* field) {
  const void* parent;
  if (field->is_extension()) {
    if (field->extension_scope() == NULL) {
      parent = field->file();
    } else {
      parent = field->extension_scope();
    }
  } else {
    parent = field->containing_type();
  }

  PointerStringPair lowercase_key(parent, field->lowercase_name().c_str());
  InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);

  PointerStringPair camelcase_key(parent, field->camelcase_name().c_str());
  InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key, field);
}